

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printVersion(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  Verbosity VVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  Verbosity old_verbosity;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"SoPlex version ",0xf);
    std::ostream::operator<<((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],".",1);
    std::ostream::operator<<((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],".",1);
    std::ostream::operator<<((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],0);
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," [mode: optimized]",0x12);
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," [precision: ",0xd);
    std::ostream::operator<<((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity]," byte]",6);
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," [rational: long double]",0x18);
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," [PaPILO: not available]",0x18);
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," [githash: ",0xb);
    __s = getGitHash();
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],"]\n",2);
    (this->spxout).m_verbosity = VVar1;
  }
  return;
}

Assistant:

void SoPlexBase<R>::printVersion() const
{
   // do not use preprocessor directives within the SPX_MSG_INFO1 macro
   SPX_MSG_INFO1(spxout, spxout << "SoPlex version " << SOPLEX_VERSION / 100
                 << "." << (SOPLEX_VERSION % 100) / 10
                 << "." << SOPLEX_VERSION % 10);

#ifndef NDEBUG
   SPX_MSG_INFO1(spxout, spxout << " [mode: debug]");
#else
   SPX_MSG_INFO1(spxout, spxout << " [mode: optimized]");
#endif

   SPX_MSG_INFO1(spxout, spxout << " [precision: " << (int)sizeof(R) << " byte]");

#ifdef SOPLEX_WITH_GMP
#ifdef mpir_version
   SPX_MSG_INFO1(spxout, spxout << " [rational: MPIR " << mpir_version << "]");
#else
   SPX_MSG_INFO1(spxout, spxout << " [rational: GMP " << gmp_version << "]");
#endif
#else
   SPX_MSG_INFO1(spxout, spxout << " [rational: long double]");
#endif


#ifdef SOPLEX_WITH_PAPILO
   SPX_MSG_INFO1(spxout, spxout << " [PaPILO  " << PAPILO_VERSION_MAJOR << "." << PAPILO_VERSION_MINOR
                 << "." << PAPILO_VERSION_PATCH);
#ifdef PAPILO_GITHASH_AVAILABLE
   SPX_MSG_INFO1(spxout, spxout << " {" <<  PAPILO_GITHASH << "}");
#endif
   SPX_MSG_INFO1(spxout, spxout << "]\n");
#else
   SPX_MSG_INFO1(spxout, spxout << " [PaPILO: not available]");
#endif

   SPX_MSG_INFO1(spxout, spxout << " [githash: " << getGitHash() << "]\n");
}